

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_parse.c
# Opt level: O1

void l2_parse_initialize(FILE *fp)

{
  l2_storage *plVar1;
  l2_gc_list *plVar2;
  l2_scope *plVar3;
  l2_call_stack *plVar4;
  l2_token_stream *plVar5;
  
  g_parser_p = (l2_parser *)malloc(0x30);
  g_parser_p->braces_flag = 0;
  plVar1 = l2_storage_create();
  g_parser_p->storage_p = plVar1;
  plVar2 = l2_gc_create();
  g_parser_p->gc_list_p = plVar2;
  plVar3 = l2_scope_create();
  g_parser_p->global_scope_p = plVar3;
  plVar4 = l2_call_stack_create();
  g_parser_p->call_stack_p = plVar4;
  plVar5 = l2_token_stream_create(fp);
  g_parser_p->token_stream_p = plVar5;
  return;
}

Assistant:

void l2_parse_initialize(FILE *fp) {
    g_parser_p = malloc(sizeof(l2_parser));
    g_parser_p->braces_flag = 0;
    g_parser_p->storage_p = l2_storage_create();
    g_parser_p->gc_list_p = l2_gc_create();
    g_parser_p->global_scope_p = l2_scope_create();
    g_parser_p->call_stack_p = l2_call_stack_create();
    g_parser_p->token_stream_p = l2_token_stream_create(fp);
}